

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::compress_block(IZDeflate *this,ct_data *ltree,ct_data *dtree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte local_49;
  int extra;
  uint code;
  uint uStack_30;
  uch flag;
  uint fx;
  uint dx;
  uint lx;
  int lc;
  uint dist;
  ct_data *dtree_local;
  ct_data *ltree_local;
  IZDeflate *this_local;
  
  fx = 0;
  uStack_30 = 0;
  code = 0;
  extra._3_1_ = 0;
  if (this->last_lit != 0) {
    do {
      if ((fx & 7) == 0) {
        extra._3_1_ = this->flag_buf[code];
        code = code + 1;
      }
      uVar3 = fx + 1;
      uVar1 = (uint)this->l_buf[fx];
      if ((extra._3_1_ & 1) == 0) {
        send_bits(this,(uint)ltree[(int)uVar1].fc.freq,(uint)ltree[(int)uVar1].dl.dad);
      }
      else {
        uVar4 = (uint)this->length_code[(int)uVar1];
        send_bits(this,(uint)ltree[uVar4 + 0x101].fc.freq,(uint)ltree[uVar4 + 0x101].dl.dad);
        if (this->extra_lbits[uVar4] != 0) {
          send_bits(this,uVar1 - this->base_length[uVar4],this->extra_lbits[uVar4]);
        }
        uVar4 = uStack_30 + 1;
        uVar1 = (uint)this->d_buf[uStack_30];
        if (uVar1 < 0x100) {
          local_49 = this->dist_code[uVar1];
        }
        else {
          local_49 = this->dist_code[(this->d_buf[uStack_30] >> 7) + 0x100];
        }
        uVar2 = (uint)local_49;
        send_bits(this,(uint)dtree[uVar2].fc.freq,(uint)dtree[uVar2].dl.dad);
        uStack_30 = uVar4;
        if (this->extra_dbits[uVar2] != 0) {
          send_bits(this,uVar1 - this->base_dist[uVar2],this->extra_dbits[uVar2]);
        }
      }
      extra._3_1_ = (byte)((int)(uint)extra._3_1_ >> 1);
      fx = uVar3;
    } while (uVar3 < this->last_lit);
  }
  send_bits(this,(uint)ltree[0x100].fc.freq,(uint)ltree[0x100].dl.dad);
  return;
}

Assistant:

void IZDeflate::compress_block(ct_data near *ltree, ct_data near *dtree)
    // ct_data near *ltree; /* literal tree */
    // ct_data near *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned dx = 0;    /* running index in d_buf */
    unsigned fx = 0;    /* running index in flag_buf */
    uch flag = 0;       /* current flags */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (last_lit != 0) do {
        if ((lx & 7) == 0) flag = flag_buf[fx++];
        lc = l_buf[lx++];
        if ((flag & 1) == 0) {
            send_code(lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = length_code[lc];
            send_code(code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(lc, extra);        /* send the extra length bits */
            }
            dist = d_buf[dx++];
            /* Here, dist is the match distance - 1 */
            code = d_code(dist);
            Assert(code < D_CODES, "bad d_code");

            send_code(code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= base_dist[code];
                send_bits(dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */
        flag >>= 1;
    } while (lx < last_lit);

    send_code(END_BLOCK, ltree);
}